

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.c
# Opt level: O0

Triangle *
TransformerTransformTriangle
          (Triangle *__return_storage_ptr__,Transformer *transformer,Triangle triangle)

{
  Vector v;
  Vector v_00;
  Vector v_01;
  Vector v3;
  undefined8 uVar1;
  Vector *__dest;
  Vector local_1f8;
  undefined1 local_1c8 [48];
  Vector local_198;
  undefined1 local_168 [48];
  Vector local_138;
  undefined1 local_108 [48];
  undefined1 local_d8 [48];
  Vector local_a8;
  Vector local_78;
  Vector local_48;
  Transformer *local_10;
  Transformer *transformer_local;
  
  local_10 = transformer;
  if (transformer == (Transformer *)0x0) {
    fprintf(_stderr,"%s: NULL pointer passed. ignored.\n","TransformerTransformTriangle");
    memcpy(__return_storage_ptr__,&triangle,0x150);
  }
  else {
    memcpy(__return_storage_ptr__,&triangle,0x150);
    __dest = __return_storage_ptr__->vertexes;
    TransformerTransformPoint(&local_48,local_10,__return_storage_ptr__->vertexes[0]);
    memcpy(__dest,&local_48,0x30);
    TransformerTransformPoint(&local_78,local_10,__return_storage_ptr__->vertexes[1]);
    memcpy(__return_storage_ptr__->vertexes + 1,&local_78,0x30);
    TransformerTransformPoint(&local_a8,local_10,__return_storage_ptr__->vertexes[2]);
    memcpy(__return_storage_ptr__->vertexes + 2,&local_a8,0x30);
    uVar1 = *(undefined8 *)&__return_storage_ptr__->vertexes[1].x;
    v3.z._8_8_ = __dest;
    v3._0_40_ = *(undefined1 (*) [40])((long)&__return_storage_ptr__->vertexes[2].x + 8);
    VectorTriangleNormal
              (*(Vector *)((long)&__return_storage_ptr__->vertexes[0].x + 8),
               *(Vector *)((long)&__return_storage_ptr__->vertexes[1].x + 8),v3);
    memcpy(__return_storage_ptr__,local_d8,0x30);
    TransformerTransformPoint(&local_138,local_10,__return_storage_ptr__->vertexNormals[0]);
    v.x._8_8_ = local_138.y._0_8_;
    v.x._0_8_ = local_138.x._8_8_;
    v.y._0_8_ = local_138.y._8_8_;
    v.y._8_8_ = local_138.z._0_8_;
    v.z._0_8_ = local_138.z._8_8_;
    v.z._8_8_ = uVar1;
    VectorL2Normalization(v);
    memcpy(__return_storage_ptr__->vertexNormals,local_108,0x30);
    TransformerTransformPoint(&local_198,local_10,__return_storage_ptr__->vertexNormals[1]);
    v_00.x._8_8_ = local_198.y._0_8_;
    v_00.x._0_8_ = local_198.x._8_8_;
    v_00.y._0_8_ = local_198.y._8_8_;
    v_00.y._8_8_ = local_198.z._0_8_;
    v_00.z._0_8_ = local_198.z._8_8_;
    v_00.z._8_8_ = uVar1;
    VectorL2Normalization(v_00);
    memcpy(__return_storage_ptr__->vertexNormals + 1,local_168,0x30);
    TransformerTransformPoint(&local_1f8,local_10,__return_storage_ptr__->vertexNormals[2]);
    v_01.x._8_8_ = local_1f8.y._0_8_;
    v_01.x._0_8_ = local_1f8.x._8_8_;
    v_01.y._0_8_ = local_1f8.y._8_8_;
    v_01.y._8_8_ = local_1f8.z._0_8_;
    v_01.z._0_8_ = local_1f8.z._8_8_;
    v_01.z._8_8_ = uVar1;
    VectorL2Normalization(v_01);
    memcpy(__return_storage_ptr__->vertexNormals + 2,local_1c8,0x30);
  }
  return __return_storage_ptr__;
}

Assistant:

Triangle TransformerTransformTriangle(const Transformer *transformer, const Triangle triangle) {
  if (transformer == NULL) {
#ifndef NDEBUG
    fprintf(stderr, "%s: NULL pointer passed. ignored.\n", __FUNCTION_NAME__);
#endif
    return triangle;
  }
  Triangle new = triangle;
  new.vertexes[0] = TransformerTransformPoint(transformer, new.vertexes[0]);
  new.vertexes[1] = TransformerTransformPoint(transformer, new.vertexes[1]);
  new.vertexes[2] = TransformerTransformPoint(transformer, new.vertexes[2]);
  new.surfaceNormal = VectorTriangleNormal(new.vertexes[0], new.vertexes[1], new.vertexes[2]);
  new.vertexNormals[0] = VectorL2Normalization(TransformerTransformPoint(transformer, new.vertexNormals[0]));
  new.vertexNormals[1] = VectorL2Normalization(TransformerTransformPoint(transformer, new.vertexNormals[1]));
  new.vertexNormals[2] = VectorL2Normalization(TransformerTransformPoint(transformer, new.vertexNormals[2]));
  return new;
}